

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Kernel * anon_unknown.dwarf_114952::LeafKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  bool bVar1;
  const_reference tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *def_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    def_local = (string *)operator_new(0x60);
    LeafKernel((LeafKernel *)def_local,def);
  }
  else {
    def_local = (string *)operator_new(0x60);
    tgt = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::front(args);
    LeafKernel((LeafKernel *)def_local,def,tgt);
  }
  return (Kernel *)def_local;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        if (args.empty())
            return new LeafKernel(def);

        return new LeafKernel(def, args.front());
    }